

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaBlockMetadata_TLSF::RemoveFreeBlock(VmaBlockMetadata_TLSF *this,Block *block)

{
  uint32_t *puVar1;
  Block *pBVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar9;
  int iVar10;
  ulong uVar8;
  
  pBVar2 = block->prevFree;
  if ((block->field_5).nextFree != (Block *)0x0) {
    ((block->field_5).nextFree)->prevFree = pBVar2;
  }
  if (pBVar2 == (Block *)0x0) {
    uVar9 = block->size;
    lVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    bVar5 = 0x38 - ((byte)lVar3 ^ 0x3f);
    if (uVar9 < 0x101) {
      bVar5 = 0;
    }
    if (bVar5 == 0) {
      uVar8 = uVar9 + 0x7ffff >> 3;
      if ((this->super_VmaBlockMetadata).m_IsVirtual == false) {
        uVar8 = uVar9 + 0x3fffff >> 6;
      }
      uVar6 = (uint)uVar8 & 0xffff;
    }
    else {
      uVar7 = (uint)(uVar9 >> (bVar5 + 2 & 0x3f)) ^ 0x20;
      uVar8 = (ulong)uVar7;
      iVar10 = (uint)bVar5 * 0x20;
      uVar7 = uVar7 & 0xffff;
      uVar6 = (iVar10 + uVar7) - 0x1c;
      if ((this->super_VmaBlockMetadata).m_IsVirtual != false) {
        uVar6 = iVar10 + uVar7;
      }
    }
    pBVar2 = (block->field_5).nextFree;
    this->m_FreeList[uVar6] = pBVar2;
    if (pBVar2 == (Block *)0x0) {
      bVar4 = (byte)uVar8 & 0x1f;
      puVar1 = this->m_InnerIsFreeBitmap + (uint)bVar5;
      *puVar1 = *puVar1 & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
      if (*puVar1 == 0) {
        this->m_IsFreeBitmap = this->m_IsFreeBitmap & ~(uint)(1L << (bVar5 & 0x3f));
      }
    }
  }
  else {
    pBVar2->field_5 = block->field_5;
    uVar9 = block->size;
  }
  block->prevFree = block;
  (block->field_5).nextFree = (Block *)0x0;
  this->m_BlocksFreeCount = this->m_BlocksFreeCount - 1;
  this->m_BlocksFreeSize = this->m_BlocksFreeSize - uVar9;
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::RemoveFreeBlock(Block* block)
{
    VMA_ASSERT(block != m_NullBlock);
    VMA_ASSERT(block->IsFree());

    if (block->NextFree() != VMA_NULL)
        block->NextFree()->PrevFree() = block->PrevFree();
    if (block->PrevFree() != VMA_NULL)
        block->PrevFree()->NextFree() = block->NextFree();
    else
    {
        uint8_t memClass = SizeToMemoryClass(block->size);
        uint16_t secondIndex = SizeToSecondIndex(block->size, memClass);
        uint32_t index = GetListIndex(memClass, secondIndex);
        VMA_ASSERT(m_FreeList[index] == block);
        m_FreeList[index] = block->NextFree();
        if (block->NextFree() == VMA_NULL)
        {
            m_InnerIsFreeBitmap[memClass] &= ~(1U << secondIndex);
            if (m_InnerIsFreeBitmap[memClass] == 0)
                m_IsFreeBitmap &= ~(1UL << memClass);
        }
    }
    block->MarkTaken();
    block->UserData() = VMA_NULL;
    --m_BlocksFreeCount;
    m_BlocksFreeSize -= block->size;
}